

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O2

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::UniqueConstraint::Deserialize(UniqueConstraint *this,Deserializer *deserializer)

{
  UniqueConstraint *this_00;
  pointer pUVar1;
  _Head_base<0UL,_duckdb::UniqueConstraint_*,_false> local_20;
  
  this_00 = (UniqueConstraint *)operator_new(0x38);
  UniqueConstraint(this_00);
  local_20._M_head_impl = this_00;
  pUVar1 = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
           ::operator->((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,200,"is_primary_key",&pUVar1->is_primary_key);
  pUVar1 = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
           ::operator->((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::LogicalIndex>(deserializer,0xc9,"index",&pUVar1->index);
  pUVar1 = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
           ::operator->((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xca,"columns",&pUVar1->columns);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> UniqueConstraint::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<UniqueConstraint>(new UniqueConstraint());
	deserializer.ReadPropertyWithDefault<bool>(200, "is_primary_key", result->is_primary_key);
	deserializer.ReadProperty<LogicalIndex>(201, "index", result->index);
	deserializer.ReadPropertyWithDefault<vector<string>>(202, "columns", result->columns);
	return std::move(result);
}